

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SharedArray.h
# Opt level: O0

shared_array<int> * __thiscall
FIX::shared_array<int>::operator=(shared_array<int> *this,shared_array<int> *rhs)

{
  shared_array<int> *rhs_local;
  shared_array<int> *this_local;
  
  if (rhs != this) {
    release(this);
    this->m_size = rhs->m_size;
    this->m_buffer = rhs->m_buffer;
    rhs->m_size = 0;
    rhs->m_buffer = (int *)0x0;
  }
  return this;
}

Assistant:

shared_array &operator=(shared_array &&rhs) noexcept {
    if (&rhs == this) {
      return *this;
    }

    release();

    m_size = rhs.m_size;
    m_buffer = rhs.m_buffer;

    rhs.m_size = 0;
    rhs.m_buffer = 0;

    return *this;
  }